

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O2

void __thiscall
topk_algorithms::ThresholdAlgorithmInstance::add
          (ThresholdAlgorithmInstance *this,Index i,KeyValue *kv)

{
  Rank *this_00;
  
  if (i < (ulong)((long)(this->_rms_list)._ranks.
                        super__Vector_base<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>,_std::allocator<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_rms_list)._ranks.
                        super__Vector_base<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>,_std::allocator<std::unique_ptr<rank::Rank,_std::default_delete<rank::Rank>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    this_00 = rank::RankList::rank(&this->_rms_list,i);
    rank::Rank::add(this_00,kv);
    this->_sum = this->_sum + kv->_value;
    return;
  }
  __assert_fail("i < _rms_list.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/laurolins[P]topkube_benchmark/src/topk_algorithms.cc"
                ,0x48,
                "void topk_algorithms::ThresholdAlgorithmInstance::add(Index, const KeyValue &)");
}

Assistant:

void ThresholdAlgorithmInstance::add(Index i, const KeyValue& kv) { assert(i < _rms_list.size()); _rms_list.rank(i)->add(kv); _sum+=kv.value(); }